

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O1

size_t __thiscall rcg::Buffer::getXPadding(Buffer *this,uint32_t part)

{
  bool bVar1;
  BUFFER_HANDLE pvVar2;
  GC_ERROR GVar3;
  void *pvVar4;
  unsigned_long ret;
  size_t size;
  INFO_DATATYPE type;
  size_t local_30 [2];
  INFO_DATATYPE local_1c;
  
  bVar1 = this->multipart;
  pvVar4 = Stream::getHandle(this->parent);
  pvVar2 = this->buffer;
  if (bVar1 == true) {
    local_30[0] = 0;
    local_30[1] = 8;
    if (pvVar2 != (BUFFER_HANDLE)0x0 && pvVar4 != (void *)0x0) {
      (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->DSGetBufferPartInfo)(pvVar4,pvVar2,part,9,&local_1c,local_30,local_30 + 1);
    }
  }
  else {
    local_30[0] = 0;
    local_30[1] = 8;
    if (pvVar2 != (BUFFER_HANDLE)0x0 && pvVar4 != (void *)0x0) {
      GVar3 = (*((this->gentl).
                 super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                DSGetBufferInfo)(pvVar4,pvVar2,0xe,&local_1c,local_30,local_30 + 1);
      if (GVar3 != 0) {
        local_30[0] = 0;
      }
    }
  }
  return local_30[0];
}

Assistant:

size_t Buffer::getXPadding(uint32_t part) const
{
  if (multipart)
  {
    return getBufferPartValue<size_t>(gentl, parent->getHandle(), buffer, part,
                                      GenTL::BUFFER_PART_INFO_XPADDING);
  }
  else
  {
    return getBufferValue<size_t>(gentl, parent->getHandle(), buffer, GenTL::BUFFER_INFO_XPADDING);
  }
}